

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

void usage(char *name)

{
  char *name_local;
  
  version(name);
  fprintf(_stderr,"usage: %s [<option>...] [<file>...]\n",name);
  fprintf(_stderr,"where <option> can be\n");
  fprintf(_stderr,"  -h          print this help information\n");
  fprintf(_stderr,"  -o <ofile>  write output to <ofile>\n");
  fprintf(_stderr,"  -v          be verbose\n");
  fprintf(_stderr,"  -V          print version number and exit\n");
  fprintf(_stderr,"if no <file> is given, input is read from stdin\n");
  fprintf(_stderr,"if no <ofile> is given, output is written to stdout\n");
  exit(1);
}

Assistant:

static void usage(char *name)
{
  version(name);
  fprintf(stderr, "usage: %s [<option>...] [<file>...]\n", name);
  fprintf(stderr, "where <option> can be\n");
  fprintf(stderr, "  -h          print this help information\n");
  fprintf(stderr, "  -o <ofile>  write output to <ofile>\n");
  fprintf(stderr, "  -v          be verbose\n");
  fprintf(stderr, "  -V          print version number and exit\n");
  fprintf(stderr, "if no <file> is given, input is read from stdin\n");
  fprintf(stderr, "if no <ofile> is given, output is written to stdout\n");
  exit(1);
}